

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderProgramResource.cpp
# Opt level: O3

bool __thiscall
glcts::GeometryShaderProgramResourceTest::checkIfResourceAtIndexIsReferenced
          (GeometryShaderProgramResourceTest *this,GLuint program_object_id,GLenum interface,
          GLuint index)

{
  RenderContext *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  GLenum props [1];
  GLint params [1];
  
  pRVar1 = ((this->super_TestCaseBase).m_context)->m_renderCtx;
  iVar2 = (*pRVar1->_vptr_RenderContext[3])(pRVar1,CONCAT44(in_register_00000034,program_object_id))
  ;
  props[0] = (this->super_TestCaseBase).m_glExtTokens.REFERENCED_BY_GEOMETRY_SHADER;
  params[0] = 0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x9c8))
            (this->m_program_object_id,interface,index,1,props,1,0,params);
  return params[0] == 1;
}

Assistant:

bool GeometryShaderProgramResourceTest::checkIfResourceAtIndexIsReferenced(glw::GLuint program_object_id,
																		   glw::GLenum interface,
																		   glw::GLuint index) const
{
	(void)program_object_id;

	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Data for getProgramResourceiv */
	glw::GLint  params[] = { 0 };
	glw::GLenum props[]  = { m_glExtTokens.REFERENCED_BY_GEOMETRY_SHADER };

	/* Get property value */
	gl.getProgramResourceiv(m_program_object_id, interface, index, 1, /* propCount */
							props, 1,								  /* bufSize */
							0,										  /* length */
							params);

	/**
	 *     The value one is written to <params> if an active
	 *     variable is referenced by the corresponding shader, or if an active
	 *     uniform block, shader storage block, or atomic counter buffer contains
	 *     at least one variable referenced by the corresponding shader.  Otherwise,
	 *     the value zero is written to <params>.
	 **/
	if (1 == params[0])
	{
		return true;
	}
	else
	{
		return false;
	}
}